

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int parse_args_DEFx(Context_conflict *ctx,int isflt)

{
  int iVar1;
  int isflt_local;
  Context_conflict *ctx_local;
  
  parse_destination_token(ctx);
  require_comma(ctx);
  iVar1 = ctx->tokenbufpos;
  ctx->tokenbufpos = iVar1 + 1;
  parse_num(ctx,isflt,ctx->tokenbuf + iVar1);
  require_comma(ctx);
  iVar1 = ctx->tokenbufpos;
  ctx->tokenbufpos = iVar1 + 1;
  parse_num(ctx,isflt,ctx->tokenbuf + iVar1);
  require_comma(ctx);
  iVar1 = ctx->tokenbufpos;
  ctx->tokenbufpos = iVar1 + 1;
  parse_num(ctx,isflt,ctx->tokenbuf + iVar1);
  require_comma(ctx);
  iVar1 = ctx->tokenbufpos;
  ctx->tokenbufpos = iVar1 + 1;
  parse_num(ctx,isflt,ctx->tokenbuf + iVar1);
  return 6;
}

Assistant:

static int parse_args_DEFx(Context *ctx, const int isflt)
{
    parse_destination_token(ctx);
    require_comma(ctx);
    parse_num(ctx, isflt, &ctx->tokenbuf[ctx->tokenbufpos++]);
    require_comma(ctx);
    parse_num(ctx, isflt, &ctx->tokenbuf[ctx->tokenbufpos++]);
    require_comma(ctx);
    parse_num(ctx, isflt, &ctx->tokenbuf[ctx->tokenbufpos++]);
    require_comma(ctx);
    parse_num(ctx, isflt, &ctx->tokenbuf[ctx->tokenbufpos++]);
    return 6;
}